

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntMathCommon.h
# Opt level: O0

bool IntMathCommon<long>::Sub(long left,long right,long *pResult)

{
  long *pResult_local;
  long right_local;
  long left_local;
  
  *pResult = left - right;
  return SBORROW8(left,right);
}

Assistant:

bool IntMathCommon<T>::Sub(T left, T right, T *pResult)
{
#if __has_builtin(__builtin_sub_overflow)
    return __builtin_sub_overflow(left, right, pResult);
#else
    // Overflow occurs when the result has a different sign from the left
    // operand, and the result has the same sign as the right operand
    *pResult = static_cast<T>(
        static_cast<UnsignedType>(left) - static_cast<UnsignedType>(right));
    return ((left ^ *pResult) & ~(right ^ *pResult)) < 0;
#endif
}